

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void gl4cts::TextureViewUtilities::getComponentSizeForInternalformat
               (GLenum internalformat,uint *out_rgba_size)

{
  TestError *this;
  uint *out_rgba_size_local;
  GLenum internalformat_local;
  
  out_rgba_size[0] = 0;
  out_rgba_size[1] = 0;
  out_rgba_size[2] = 0;
  out_rgba_size[3] = 0;
  if (internalformat == 0x8051) goto LAB_011291c1;
  if (internalformat == 0x8054) goto LAB_0112919c;
  if (internalformat == 0x8056) {
    *out_rgba_size = 4;
    out_rgba_size[1] = 4;
    out_rgba_size[2] = 4;
    out_rgba_size[3] = 4;
    return;
  }
  if (internalformat == 0x8057) {
    *out_rgba_size = 5;
    out_rgba_size[1] = 5;
    out_rgba_size[2] = 5;
    out_rgba_size[3] = 1;
    return;
  }
  if (internalformat == 0x8058) goto LAB_0112903d;
  if (internalformat == 0x8059) {
LAB_0112906d:
    *out_rgba_size = 10;
    out_rgba_size[1] = 10;
    out_rgba_size[2] = 10;
    out_rgba_size[3] = 2;
    return;
  }
  if (internalformat == 0x805b) goto LAB_0112900d;
  if (internalformat != 0x81a5) {
    if (internalformat == 0x81a6) {
      *out_rgba_size = 0x18;
      return;
    }
    if (internalformat == 0x8229) {
LAB_01129252:
      *out_rgba_size = 8;
      return;
    }
    if (internalformat != 0x822a) {
      if (internalformat == 0x822b) {
LAB_0112921a:
        *out_rgba_size = 8;
        out_rgba_size[1] = 8;
        return;
      }
      if (internalformat != 0x822c) {
        if (internalformat == 0x822d) goto LAB_01129243;
        if (internalformat == 0x822e) {
LAB_01129234:
          *out_rgba_size = 0x20;
          return;
        }
        if (internalformat != 0x822f) {
          if (internalformat == 0x8230) {
LAB_011291e6:
            *out_rgba_size = 0x20;
            out_rgba_size[1] = 0x20;
            return;
          }
          if (internalformat - 0x8231 < 2) goto LAB_01129252;
          if (internalformat - 0x8233 < 2) goto LAB_01129243;
          if (internalformat - 0x8235 < 2) goto LAB_01129234;
          if (internalformat - 0x8237 < 2) goto LAB_0112921a;
          if (internalformat - 0x8239 < 2) goto LAB_01129200;
          if (internalformat - 0x823b < 2) goto LAB_011291e6;
          if (internalformat == 0x8814) {
LAB_01128fdd:
            *out_rgba_size = 0x20;
            out_rgba_size[1] = 0x20;
            out_rgba_size[2] = 0x20;
            out_rgba_size[3] = 0x20;
            return;
          }
          if (internalformat == 0x8815) {
LAB_01129177:
            *out_rgba_size = 0x20;
            out_rgba_size[1] = 0x20;
            out_rgba_size[2] = 0x20;
            return;
          }
          if (internalformat == 0x881a) {
LAB_0112900d:
            *out_rgba_size = 0x10;
            out_rgba_size[1] = 0x10;
            out_rgba_size[2] = 0x10;
            out_rgba_size[3] = 0x10;
            return;
          }
          if (internalformat == 0x881b) {
LAB_0112919c:
            *out_rgba_size = 0x10;
            out_rgba_size[1] = 0x10;
            out_rgba_size[2] = 0x10;
            return;
          }
          if (internalformat == 0x88f0) {
            *out_rgba_size = 0x18;
            out_rgba_size[1] = 8;
            return;
          }
          if (internalformat == 0x8c3a) {
            *out_rgba_size = 0xb;
            out_rgba_size[1] = 0xb;
            out_rgba_size[2] = 10;
            return;
          }
          if (internalformat == 0x8c3d) {
            *out_rgba_size = 9;
            out_rgba_size[1] = 9;
            out_rgba_size[2] = 9;
            out_rgba_size[3] = 5;
            return;
          }
          if (internalformat == 0x8c41) goto LAB_011291c1;
          if (internalformat == 0x8c43) goto LAB_0112903d;
          if (internalformat == 0x8cad) {
            *out_rgba_size = 0x20;
            out_rgba_size[1] = 8;
            return;
          }
          if (internalformat == 0x8d62) {
            *out_rgba_size = 5;
            out_rgba_size[1] = 6;
            out_rgba_size[2] = 5;
            return;
          }
          if (internalformat == 0x8d70) goto LAB_01128fdd;
          if (internalformat == 0x8d71) goto LAB_01129177;
          if (internalformat == 0x8d76) goto LAB_0112900d;
          if (internalformat == 0x8d77) goto LAB_0112919c;
          if (internalformat == 0x8d7c) goto LAB_0112903d;
          if (internalformat == 0x8d7d) goto LAB_011291c1;
          if (internalformat == 0x8d82) goto LAB_01128fdd;
          if (internalformat == 0x8d83) goto LAB_01129177;
          if (internalformat == 0x8d88) goto LAB_0112900d;
          if (internalformat == 0x8d89) goto LAB_0112919c;
          if (internalformat != 0x8d8e) {
            if (internalformat != 0x8d8f) {
              if (internalformat == 0x8f94) goto LAB_01129252;
              if (internalformat == 0x8f95) goto LAB_0112921a;
              if (internalformat != 0x8f96) {
                if (internalformat != 0x8f97) {
                  if (internalformat == 0x8f98) goto LAB_01129243;
                  if (internalformat == 0x8f99) goto LAB_01129200;
                  if (internalformat != 0x8f9a) {
                    if (internalformat != 0x8f9b) {
                      if (internalformat != 0x906f) {
                        this = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (this,"Unrecognized internalformat",(char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                                   ,0x24f);
                        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                      }
                      goto LAB_0112906d;
                    }
                    goto LAB_0112900d;
                  }
                  goto LAB_0112919c;
                }
                goto LAB_0112903d;
              }
            }
LAB_011291c1:
            *out_rgba_size = 8;
            out_rgba_size[1] = 8;
            out_rgba_size[2] = 8;
            return;
          }
LAB_0112903d:
          *out_rgba_size = 8;
          out_rgba_size[1] = 8;
          out_rgba_size[2] = 8;
          out_rgba_size[3] = 8;
          return;
        }
      }
LAB_01129200:
      *out_rgba_size = 0x10;
      out_rgba_size[1] = 0x10;
      return;
    }
  }
LAB_01129243:
  *out_rgba_size = 0x10;
  return;
}

Assistant:

void TextureViewUtilities::getComponentSizeForInternalformat(const glw::GLenum internalformat,
															 unsigned int*	 out_rgba_size)
{
	/* Note: Compressed textures are not supported by this function */

	/* Reset all the values before we continue. */
	memset(out_rgba_size, 0, 4 /* rgba */ * sizeof(unsigned int));

	/* Depending on the user-specified internalformat, update relevant arguments */
	switch (internalformat)
	{
	case GL_RGBA32F:
	case GL_RGBA32I:
	case GL_RGBA32UI:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 32;
		out_rgba_size[2] = 32;
		out_rgba_size[3] = 32;

		break;
	}

	case GL_RGBA16F:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA16:
	case GL_RGBA16_SNORM:
	{
		out_rgba_size[0] = 16;
		out_rgba_size[1] = 16;
		out_rgba_size[2] = 16;
		out_rgba_size[3] = 16;

		break;
	}

	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_SRGB8_ALPHA8:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 8;
		out_rgba_size[2] = 8;
		out_rgba_size[3] = 8;

		break;
	}

	case GL_RGB10_A2:
	case GL_RGB10_A2UI:
	{
		out_rgba_size[0] = 10;
		out_rgba_size[1] = 10;
		out_rgba_size[2] = 10;
		out_rgba_size[3] = 2;

		break;
	}

	case GL_RGB5_A1:
	{
		out_rgba_size[0] = 5;
		out_rgba_size[1] = 5;
		out_rgba_size[2] = 5;
		out_rgba_size[3] = 1;

		break;
	}

	case GL_RGBA4:
	{
		out_rgba_size[0] = 4;
		out_rgba_size[1] = 4;
		out_rgba_size[2] = 4;
		out_rgba_size[3] = 4;

		break;
	}

	case GL_RGB9_E5:
	{
		out_rgba_size[0] = 9;
		out_rgba_size[1] = 9;
		out_rgba_size[2] = 9;
		out_rgba_size[3] = 5;

		break;
	}

	case GL_R11F_G11F_B10F:
	{
		out_rgba_size[0] = 11;
		out_rgba_size[1] = 11;
		out_rgba_size[2] = 10;

		break;
	}

	case GL_RGB565:
	{
		out_rgba_size[0] = 5;
		out_rgba_size[1] = 6;
		out_rgba_size[2] = 5;

		break;
	}

	case GL_RGB32F:
	case GL_RGB32I:
	case GL_RGB32UI:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 32;
		out_rgba_size[2] = 32;

		break;
	}

	case GL_RGB16_SNORM:
	case GL_RGB16F:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB16:
	{
		out_rgba_size[0] = 16;
		out_rgba_size[1] = 16;
		out_rgba_size[2] = 16;

		break;
	}

	case GL_RGB8_SNORM:
	case GL_RGB8:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_SRGB8:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 8;
		out_rgba_size[2] = 8;

		break;
	}

	case GL_RG32F:
	case GL_RG32I:
	case GL_RG32UI:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 32;

		break;
	}

	case GL_RG16:
	case GL_RG16F:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG16_SNORM:
	{
		out_rgba_size[0] = 16;
		out_rgba_size[1] = 16;

		break;
	}

	case GL_RG8:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG8_SNORM:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 8;

		break;
	}

	case GL_R32F:
	case GL_R32I:
	case GL_R32UI:
	{
		out_rgba_size[0] = 32;

		break;
	}

	case GL_R16F:
	case GL_R16I:
	case GL_R16UI:
	case GL_R16:
	case GL_R16_SNORM:
	case GL_DEPTH_COMPONENT16:
	{
		out_rgba_size[0] = 16;

		break;
	}

	case GL_R8:
	case GL_R8I:
	case GL_R8UI:
	case GL_R8_SNORM:
	{
		out_rgba_size[0] = 8;

		break;
	}

	case GL_DEPTH_COMPONENT24:
	{
		out_rgba_size[0] = 24;

		break;
	}

	case GL_DEPTH32F_STENCIL8:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 8;

		break;
	}

	case GL_DEPTH24_STENCIL8:
	{
		out_rgba_size[0] = 24;
		out_rgba_size[1] = 8;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (interalformat) */
}